

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

vm_obj_id_t CVmObjVector::create_fill(int in_root_set,size_t element_count,...)

{
  char in_AL;
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  undefined4 in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vm_val_t *val;
  size_t i;
  va_list args;
  CVmObjVector *vec;
  vm_obj_id_t id;
  char *in_stack_fffffffffffffee8;
  CVmObjVector *in_stack_fffffffffffffef0;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  ulong local_40;
  CVmObjVector local_38;
  undefined1 *local_28;
  void *local_20;
  vm_obj_id_t local_14;
  ulong local_10;
  undefined4 local_4;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_14 = vm_new_id((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (int)in_stack_fffffffffffffef0,
                       (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  pvVar1 = CVmObject::operator_new
                     ((size_t)in_stack_fffffffffffffef0,
                      (vm_obj_id_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  CVmObjVector(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
  local_28 = local_f8;
  local_38.super_CVmObjCollection.super_CVmObject.ext_ = &stack0x00000008;
  local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject._4_4_ = 0x30;
  local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject._0_4_ = 0x10;
  local_20 = pvVar1;
  for (local_40 = 0; local_40 < local_10; local_40 = local_40 + 1) {
    in_stack_fffffffffffffef0 = &local_38;
    if ((uint)local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject < 0x29) {
      in_stack_fffffffffffffee8 =
           local_28 + (int)(uint)local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject;
      local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject._0_4_ =
           (uint)local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject + 8;
    }
    else {
      in_stack_fffffffffffffee8 = local_38.super_CVmObjCollection.super_CVmObject.ext_;
      local_38.super_CVmObjCollection.super_CVmObject.ext_ =
           local_38.super_CVmObjCollection.super_CVmObject.ext_ + 8;
    }
    local_48 = *(undefined8 *)in_stack_fffffffffffffee8;
    set_element(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8,(vm_val_t *)0x34df4a);
  }
  set_element_count(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
  return local_14;
}

Assistant:

vm_obj_id_t CVmObjVector::create_fill(VMG_ int in_root_set,
                                      size_t element_count, ...)
{
    /* create the object */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);
    CVmObjVector *vec = new (vmg_ id) CVmObjVector(vmg_ element_count);

    /* populate the elements */
    va_list args;
    va_start(args, element_count);
    for (size_t i = 0 ; i < element_count ; ++i)
    {
        /* get the next value */
        const vm_val_t *val = va_arg(args, const vm_val_t *);

        /* store it */
        vec->set_element(i, val);
    }
    va_end(args);

    /* set the element count */
    vec->set_element_count(element_count);

    /* return the new object's ID */
    return id;
}